

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O0

bool dxil_spv::emit_ray_query_proceed_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Value *operand;
  Operation *this;
  Operation *op;
  CallInst *pCStack_20;
  Id ray_object_id;
  CallInst *instruction_local;
  Impl *impl_local;
  
  op._4_4_ = 0;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  operand = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = build_ray_query_object(impl,operand,(Id *)((long)&op + 4),(uint32_t *)0x0);
  if (bVar1) {
    this = Converter::Impl::allocate
                     ((Impl *)instruction_local,OpRayQueryProceedKHR,(Value *)pCStack_20);
    Operation::add_id(this,op._4_4_);
    Converter::Impl::add((Impl *)instruction_local,this,false);
  }
  return bVar1;
}

Assistant:

bool emit_ray_query_proceed_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id ray_object_id = 0;
	if (!build_ray_query_object(impl, instruction->getOperand(1), ray_object_id))
		return false;

	auto *op = impl.allocate(spv::OpRayQueryProceedKHR, instruction);
	op->add_id(ray_object_id);
	impl.add(op);
	return true;
}